

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::Simple16<false>::decodeArray
          (Simple16<false> *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  size_t extraout_RDX;
  uint *local_30;
  uint32_t *local_28;
  
  uVar1 = (ulong)(uint)*nvalue;
  *nvalue = uVar1;
  local_30 = in;
  if (uVar1 != 0) {
    local_28 = out;
    do {
      (**(code **)(unpackarray + (ulong)(*local_30 >> 0x1c) * 8))(&local_28,&local_30,param_2);
      param_2 = extraout_RDX;
    } while (local_28 < out + uVar1);
  }
  return local_30;
}

Assistant:

const uint32_t *Simple16<MarkLength>::decodeArray(const uint32_t *in,
#ifndef NDEBUG
                                                  const size_t len,
                                                  uint32_t *out,
                                                  size_t &nvalue) {
#else
                                                  const size_t, uint32_t *out,
                                                  size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const endin = in + len;
#endif
  if (MarkLength)
    if ((*in) > nvalue)
      throw NotEnoughStorage(*in);
  const uint32_t actualvalue =
      MarkLength ? *(in++) : static_cast<uint32_t>(nvalue);
  if (nvalue < actualvalue)
    fprintf(stderr, "possible overrun\n");
  nvalue = actualvalue;
#ifdef STATS
  printf("simple16 decode %zu\n", len);
  std::vector<uint32_t> stats(16, 0);
#endif
  const uint32_t *const end = out + nvalue;
  while (end > out) {
#ifdef STATS
    stats[which(in)]++;
#endif
    (unpackarray[which(in)])(&out, &in);
  }

#ifdef STATS
  uint32_t sum = std::accumulate(stats.begin(), stats.end(), 0);
  for (uint32_t k = 0; k < stats.size(); ++k) {
    printf("simple16 stats[%u]=%f\n", k, stats[k] * 1.0 / sum);
  }
#endif
  ASSERT(in <= endin, std::to_string(in - endin));
  return in;
}